

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismExtend.cpp
# Opt level: O0

int pztopology::Pr<pztopology::TPZPoint>::SideDimension(int side)

{
  ostream *this;
  void *this_00;
  int in_EDI;
  int fatherside;
  int ftns;
  int local_4;
  
  if ((in_EDI < 0) || (2 < in_EDI)) {
    this = std::operator<<((ostream *)&std::cerr,"Pr<TFather>::SideDimension side ");
    this_00 = (void *)std::ostream::operator<<(this,in_EDI);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_4 = -1;
  }
  else if (in_EDI / 1 < 2) {
    local_4 = TPZPoint::SideDimension(in_EDI % 1);
  }
  else {
    local_4 = TPZPoint::SideDimension(in_EDI % 1);
    local_4 = local_4 + 1;
  }
  return local_4;
}

Assistant:

int Pr<TFather>::SideDimension(int side) {
		if(side<0 || side >= NSides) {
			PZError << "Pr<TFather>::SideDimension side " << side << endl;
			return -1;
		}
		int ftns = side/TFather::NSides;
		int fatherside = side%TFather::NSides;
		if(ftns < 2) return TFather::SideDimension(fatherside);
		return TFather::SideDimension(fatherside)+1;
	}